

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O2

uint32_t * FastPForLib::__fastpackwithoutmask24_24(uint32_t *in,uint32_t *out)

{
  bool bVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined8 in_RAX;
  ulong uVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [32];
  undefined1 auVar8 [64];
  undefined1 auVar9 [64];
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  undefined1 auVar13 [64];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar12 [64];
  
  vpmovsxbd_avx512f(_DAT_001926a0);
  auVar6 = vpmovsxbq_avx(ZEXT216(0x104));
  uVar5 = CONCAT62((int6)((ulong)in_RAX >> 0x10),0x40);
  auVar8 = vpgatherdd_avx512f(*(undefined4 *)((long)in + uVar5));
  auVar14._8_8_ = 0x1000000008;
  auVar14._0_8_ = 0x1000000008;
  auVar7 = vextracti64x4_avx512f(auVar8,1);
  auVar2 = vpalignr_avx(auVar8._16_16_,auVar8._0_16_,0xc);
  auVar15 = vpshufd_avx(auVar8._16_16_,0xee);
  auVar3 = vpshufd_avx(auVar7._0_16_,0xe9);
  auVar16 = vpsrlvd_avx2(auVar8._0_16_,auVar14);
  auVar15 = vpsrlvd_avx2(auVar15,auVar14);
  auVar3 = vpsrlvd_avx2(auVar3,auVar14);
  auVar4 = vpsrlvd_avx2(auVar7._16_16_,auVar14);
  auVar8 = vpsllvd_avx512f(auVar8,_DAT_0019e800);
  auVar6 = vpermi2d_avx512vl(auVar6,auVar16,ZEXT416(*in));
  auVar6 = vpinsrd_avx(auVar6,in[4],3);
  auVar2 = vpsrlvd_avx2(auVar2,auVar14);
  auVar16 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar2;
  auVar9 = vpmovsxbd_avx512f(_DAT_001926b0);
  auVar10 = vpbroadcastd_avx512f(ZEXT416(in[8]));
  bVar1 = SUB81((uVar5 & 0xffffffff) >> 6,0);
  auVar9 = vpermi2d_avx512f(auVar9,ZEXT3264(CONCAT428(auVar16._12_4_,
                                                      CONCAT424((uint)bVar1 * auVar10._24_4_ |
                                                                (uint)!bVar1 * auVar16._8_4_,
                                                                CONCAT420(auVar16._4_4_,
                                                                          CONCAT416(auVar16._0_4_,
                                                                                    ZEXT116(0) *
                                                                                    auVar2 + ZEXT116
                                                  (1) * auVar6))))),ZEXT1664(auVar15));
  auVar10 = vpmovsxbq_avx512f(ZEXT816(0x80403020100));
  auVar11 = vpmovsxbd_avx512f(_DAT_00184370);
  auVar12 = vpbroadcastd_avx512f(ZEXT416(in[0xc]));
  auVar13._0_36_ = auVar9._0_36_;
  auVar13._36_4_ = auVar12._36_4_;
  auVar13._40_4_ = auVar9._40_4_;
  auVar13._44_4_ = auVar9._44_4_;
  auVar13._48_4_ = auVar9._48_4_;
  auVar13._52_4_ = auVar9._52_4_;
  auVar13._56_4_ = auVar9._56_4_;
  auVar13._60_4_ = auVar9._60_4_;
  auVar9 = vpermi2q_avx512f(auVar10,auVar13,ZEXT1664(auVar3));
  auVar10 = vpbroadcastd_avx512f(ZEXT416(in[0x10]));
  auVar12._0_48_ = auVar9._0_48_;
  auVar12._48_4_ = auVar10._48_4_;
  auVar12._52_4_ = auVar9._52_4_;
  auVar12._56_4_ = auVar9._56_4_;
  auVar12._60_4_ = auVar9._60_4_;
  auVar9 = vpermi2d_avx512f(auVar11,auVar12,ZEXT1664(auVar4));
  auVar7 = vpermq_avx2(auVar7,0xff);
  auVar10 = vpbroadcastd_avx512f(ZEXT416(in[0x14]));
  auVar10._0_60_ = auVar9._0_60_;
  auVar8 = vpord_avx512f(auVar8,auVar10);
  auVar2 = vpmovsxbd_avx(ZEXT416(0x401));
  auVar8 = vmovdqu64_avx512f(auVar8);
  *(undefined1 (*) [64])out = auVar8;
  auVar15._8_8_ = 0;
  auVar15._0_8_ = *(ulong *)(in + 0x16);
  auVar6 = vpermi2d_avx512vl(auVar2,auVar7._0_16_,auVar15);
  auVar2 = vpsllvd_avx2(auVar15,_DAT_0019d330);
  auVar6 = vpsrlvd_avx2(auVar6,auVar14);
  auVar2 = vpor_avx(auVar2,auVar6);
  *(long *)(out + 0x10) = auVar2._0_8_;
  return out + 0x12;
}

Assistant:

uint32_t *__fastpackwithoutmask24_24(const uint32_t *__restrict__ in,
                                     uint32_t *__restrict__ out) {

  *out = (*in);
  ++in;
  *out |= ((*in)) << 24;
  ++out;
  *out = ((*in)) >> (24 - 16);
  ++in;
  *out |= ((*in)) << 16;
  ++out;
  *out = ((*in)) >> (24 - 8);
  ++in;
  *out |= ((*in)) << 8;
  ++out;
  ++in;
  *out = (*in);
  ++in;
  *out |= ((*in)) << 24;
  ++out;
  *out = ((*in)) >> (24 - 16);
  ++in;
  *out |= ((*in)) << 16;
  ++out;
  *out = ((*in)) >> (24 - 8);
  ++in;
  *out |= ((*in)) << 8;
  ++out;
  ++in;
  *out = (*in);
  ++in;
  *out |= ((*in)) << 24;
  ++out;
  *out = ((*in)) >> (24 - 16);
  ++in;
  *out |= ((*in)) << 16;
  ++out;
  *out = ((*in)) >> (24 - 8);
  ++in;
  *out |= ((*in)) << 8;
  ++out;
  ++in;
  *out = (*in);
  ++in;
  *out |= ((*in)) << 24;
  ++out;
  *out = ((*in)) >> (24 - 16);
  ++in;
  *out |= ((*in)) << 16;
  ++out;
  *out = ((*in)) >> (24 - 8);
  ++in;
  *out |= ((*in)) << 8;
  ++out;
  ++in;
  *out = (*in);
  ++in;
  *out |= ((*in)) << 24;
  ++out;
  *out = ((*in)) >> (24 - 16);
  ++in;
  *out |= ((*in)) << 16;
  ++out;
  *out = ((*in)) >> (24 - 8);
  ++in;
  *out |= ((*in)) << 8;
  ++out;
  ++in;
  *out = (*in);
  ++in;
  *out |= ((*in)) << 24;
  ++out;
  *out = ((*in)) >> (24 - 16);
  ++in;
  *out |= ((*in)) << 16;
  ++out;
  *out = ((*in)) >> (24 - 8);
  ++in;
  *out |= ((*in)) << 8;
  ++out;
  ++in;

  return out;
}